

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniDFS.cpp
# Opt level: O1

void __thiscall DataServer::saveFile(DataServer *this)

{
  undefined8 *puVar1;
  uint uVar2;
  long lVar3;
  _Base_ptr p_Var4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long *plVar8;
  void *pvVar9;
  undefined8 *puVar10;
  _Rb_tree_iterator<std::pair<const_int,_fileRange>_> _Var11;
  long *plVar12;
  ulong *puVar13;
  ulong uVar14;
  uint uVar15;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_fileRange>_>,_std::_Rb_tree_iterator<std::pair<const_int,_fileRange>_>_>
  pVar16;
  string nodePath;
  string __str_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string __str;
  long *local_318;
  long local_308;
  long lStack_300;
  ulong *local_2f8;
  long local_2f0;
  ulong local_2e8 [2];
  ulong *local_2d8;
  long local_2d0;
  ulong local_2c8;
  long lStack_2c0;
  _Base_ptr local_2b8;
  long local_2b0;
  undefined8 *local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  long *local_288;
  long local_280;
  long local_278;
  long lStack_270;
  undefined1 *local_268 [2];
  undefined1 local_258 [16];
  undefined8 local_248;
  undefined1 *local_240;
  _Base_ptr local_238;
  undefined1 *local_230;
  filebuf local_228 [8];
  undefined1 local_220 [232];
  ios_base local_138 [264];
  
  pVar16 = std::
           _Rb_tree<int,_std::pair<const_int,_fileRange>,_std::_Select1st<std::pair<const_int,_fileRange>_>,_std::less<int>,_std::allocator<std::pair<const_int,_fileRange>_>_>
           ::equal_range(&server_fileRangesMap._M_t,&this->serverId);
  local_2b8 = (_Base_ptr)pVar16.second._M_node;
  _Var11 = pVar16.first._M_node;
  uVar2 = this->serverId;
  uVar5 = -uVar2;
  if (0 < (int)uVar2) {
    uVar5 = uVar2;
  }
  uVar15 = 1;
  if (9 < uVar5) {
    uVar14 = (ulong)uVar5;
    uVar6 = 4;
    do {
      uVar15 = uVar6;
      uVar7 = (uint)uVar14;
      if (uVar7 < 100) {
        uVar15 = uVar15 - 2;
        goto LAB_00119e56;
      }
      if (uVar7 < 1000) {
        uVar15 = uVar15 - 1;
        goto LAB_00119e56;
      }
      if (uVar7 < 10000) goto LAB_00119e56;
      uVar14 = uVar14 / 10000;
      uVar6 = uVar15 + 4;
    } while (99999 < uVar7);
    uVar15 = uVar15 + 1;
  }
LAB_00119e56:
  local_230 = local_220;
  std::__cxx11::string::_M_construct((ulong)&local_230,(char)uVar15 - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>(local_230 + (uVar2 >> 0x1f),uVar15,uVar5);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_230,0,(char *)0x0,0x133326);
  local_318 = &local_308;
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_308 = *plVar12;
    lStack_300 = plVar8[3];
  }
  else {
    local_308 = *plVar12;
    local_318 = (long *)*plVar8;
  }
  lVar3 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if (local_230 != local_220) {
    operator_delete(local_230);
  }
  if (_Var11._M_node != local_2b8) {
    local_240 = _VTT;
    local_248 = ___throw_bad_array_new_length;
    do {
      uVar2 = *(uint *)((long)&_Var11._M_node[1]._M_left + 4);
      p_Var4 = _Var11._M_node[1]._M_parent;
      local_2b0 = (long)*(int *)&_Var11._M_node[1]._M_left;
      local_238 = _Var11._M_node;
      pvVar9 = operator_new__(0x200000);
      std::istream::seekg(0x14f768,(_Ios_Seekdir)p_Var4);
      std::istream::read(ifs,(long)pvVar9);
      std::istream::seekg(0x14f768,_S_beg);
      std::ofstream::ofstream((string *)&local_230);
      local_268[0] = local_258;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_268,local_318,lVar3 + (long)local_318);
      std::__cxx11::string::append((char *)local_268);
      plVar8 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_268,(ulong)desFileName_abi_cxx11_._M_dataplus._M_p);
      plVar12 = plVar8 + 2;
      if ((long *)*plVar8 == plVar12) {
        local_278 = *plVar12;
        lStack_270 = plVar8[3];
        local_288 = &local_278;
      }
      else {
        local_278 = *plVar12;
        local_288 = (long *)*plVar8;
      }
      local_280 = plVar8[1];
      *plVar8 = (long)plVar12;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_288);
      local_2d8 = &local_2c8;
      puVar13 = (ulong *)(plVar8 + 2);
      if ((ulong *)*plVar8 == puVar13) {
        local_2c8 = *puVar13;
        lStack_2c0 = plVar8[3];
      }
      else {
        local_2c8 = *puVar13;
        local_2d8 = (ulong *)*plVar8;
      }
      local_2d0 = plVar8[1];
      *plVar8 = (long)puVar13;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      uVar5 = -uVar2;
      if (0 < (int)uVar2) {
        uVar5 = uVar2;
      }
      uVar15 = 1;
      if (9 < uVar5) {
        uVar14 = (ulong)uVar5;
        uVar6 = 4;
        do {
          uVar15 = uVar6;
          uVar7 = (uint)uVar14;
          if (uVar7 < 100) {
            uVar15 = uVar15 - 2;
            goto LAB_0011a0f3;
          }
          if (uVar7 < 1000) {
            uVar15 = uVar15 - 1;
            goto LAB_0011a0f3;
          }
          if (uVar7 < 10000) goto LAB_0011a0f3;
          uVar14 = uVar14 / 10000;
          uVar6 = uVar15 + 4;
        } while (99999 < uVar7);
        uVar15 = uVar15 + 1;
      }
LAB_0011a0f3:
      local_2f8 = local_2e8;
      std::__cxx11::string::_M_construct
                ((ulong)&local_2f8,(char)uVar15 - (char)((int)uVar2 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_2f8),uVar15,uVar5);
      uVar14 = 0xf;
      if (local_2d8 != &local_2c8) {
        uVar14 = local_2c8;
      }
      if (uVar14 < (ulong)(local_2f0 + local_2d0)) {
        uVar14 = 0xf;
        if (local_2f8 != local_2e8) {
          uVar14 = local_2e8[0];
        }
        if (uVar14 < (ulong)(local_2f0 + local_2d0)) goto LAB_0011a176;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_2f8,0,(char *)0x0,(ulong)local_2d8);
      }
      else {
LAB_0011a176:
        puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2d8,(ulong)local_2f8)
        ;
      }
      puVar1 = puVar10 + 2;
      if ((undefined8 *)*puVar10 == puVar1) {
        local_298 = *puVar1;
        uStack_290 = puVar10[3];
        local_2a8 = &local_298;
      }
      else {
        local_298 = *puVar1;
        local_2a8 = (undefined8 *)*puVar10;
      }
      local_2a0 = puVar10[1];
      *puVar10 = puVar1;
      puVar10[1] = 0;
      *(undefined1 *)puVar1 = 0;
      std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_2a8);
      if (local_2a8 != &local_298) {
        operator_delete(local_2a8);
      }
      if (local_2f8 != local_2e8) {
        operator_delete(local_2f8);
      }
      if (local_2d8 != &local_2c8) {
        operator_delete(local_2d8);
      }
      if (local_288 != &local_278) {
        operator_delete(local_288);
      }
      if (local_268[0] != local_258) {
        operator_delete(local_268[0]);
      }
      std::ostream::write((char *)&local_230,(long)pvVar9);
      std::ofstream::close();
      operator_delete__(pvVar9);
      local_230 = local_240;
      *(undefined8 *)(local_228 + *(long *)(local_240 + -0x18) + -8) = local_248;
      std::filebuf::~filebuf(local_228);
      std::ios_base::~ios_base(local_138);
      _Var11._M_node = (_Base_ptr)std::_Rb_tree_increment(local_238);
    } while (_Var11._M_node != local_2b8);
  }
  if (local_318 != &local_308) {
    operator_delete(local_318);
  }
  return;
}

Assistant:

void saveFile() const
    {
        // dfs/datanode[1,2,3,4]/
        // check the server_fileRangesMap
        // <serverid, range{from, count, blockid}>
        auto fileRanges = server_fileRangesMap.equal_range(serverId);
        string nodePath = "dfsfiles/datanode" + to_string(serverId);
        for (auto f_it = fileRanges.first; f_it!= fileRanges.second; ++f_it)
        {
            int _blockId = (f_it->second).blockId;
            long long _from = (f_it->second).from;
            int _count = (f_it->second).count;
            char *buffer = new char[block_size_int];
            ifs.seekg(_from, ifs.beg);

            ifs.read(buffer, _count);

            ifs.seekg(0, ifs.beg);

            ofstream myblockFile;

            myblockFile.open(nodePath + "/" + desFileName + "-part" + to_string(_blockId));

            myblockFile.write(buffer, _count);

            myblockFile.close();

            delete[] buffer;
        }


    }